

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

double __thiscall
ON_NurbsSurface::GetCubicBezierApproximation
          (ON_NurbsSurface *this,double max_deviation,ON_3dPoint (*bezCV) [4])

{
  double *pdVar1;
  double *g_00;
  double *pdVar2;
  double dVar3;
  double s;
  double dVar4;
  double t;
  double max_deviation_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  ON_3dPoint *pOVar11;
  uint uVar12;
  int iVar13;
  int j;
  long lVar14;
  ON_3dPoint *pOVar15;
  int i;
  long lVar16;
  ulong uVar17;
  int hint [2];
  ON_3dPoint nurbsP;
  ON_3dPoint bezP;
  double *g [2];
  ON_2dex cvdex [4];
  double c [4];
  ON_BezierSurface bezS;
  ON_3dPoint srfP [4];
  ON_3dPoint Q [4];
  double g_buffer [64];
  double local_490;
  double local_480;
  double local_470;
  int local_45c;
  long local_458;
  undefined8 local_440;
  ON_3dPoint local_438;
  ON_3dVector local_418;
  ON_3dPoint local_3f8;
  double local_3e0;
  ON_3dPoint local_3d8;
  ON_2dex local_3c0;
  ON_Interval local_3b8;
  ON_Interval local_3a8;
  double local_398 [5];
  ON_BezierSurface local_370;
  ON_3dPoint local_348;
  double local_330;
  double dStack_328;
  double local_320;
  double local_318;
  double dStack_310;
  double local_308;
  double local_300;
  double dStack_2f8;
  double local_2f0;
  ON_3dPoint local_2e8;
  ON_3dPoint local_2d0;
  ON_3dPoint local_2b8;
  ON_3dPoint local_2a0;
  ON_3dPoint local_280;
  ON_3dPoint local_268;
  ON_3dPoint local_250;
  ON_3dPoint local_238 [21];
  ON_NurbsCurve *this_00;
  
  max_deviation_00 = ON_DBL_QNAN;
  local_470 = ON_DBL_QNAN;
  local_3e0 = max_deviation;
  bVar5 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if ((((!bVar5) && (1 < this->m_order[0])) && (1 < this->m_order[1])) &&
     ((this->m_cv_count[0] < 0x41 && this->m_order[0] <= this->m_cv_count[0] &&
      (this->m_cv_count[1] < 0x41 && this->m_order[1] <= this->m_cv_count[1])))) {
    uVar17 = 0;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    local_398[0] = ON_Interval::operator[](&local_3a8,0);
    local_398[1] = ON_Interval::operator[](&local_3b8,1);
    local_398[2] = ON_Interval::operator[](&local_3a8,1);
    local_398[3] = ON_Interval::operator[](&local_3b8,0);
    bVar5 = false;
    local_480 = 0.0;
    do {
      iVar7 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                        (SUB84(local_398[uVar17],0),this,(ulong)((uint)uVar17 & 1));
      this_00 = (ON_NurbsCurve *)CONCAT44(extraout_var,iVar7);
      if (this_00 == (ON_NurbsCurve *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = ON_Object::IsKindOf((ON_Object *)this_00,&ON_NurbsCurve::m_ON_NurbsCurve_class_rtti)
        ;
        dVar3 = max_deviation_00;
        if (bVar6) {
          pOVar15 = *bezCV;
          if (uVar17 == 1) {
            pOVar15 = bezCV[3];
          }
          if ((uVar17 & 1) == 0) {
            pOVar15 = &local_2e8;
          }
          dVar3 = ON_NurbsCurve::GetCubicBezierApproximation(this_00,max_deviation_00,pOVar15);
        }
        bVar6 = 0.0 <= dVar3;
        if (bVar6) {
          if ((uVar17 & 1) == 0) {
            lVar10 = 0x48;
            if (uVar17 == 0) {
              lVar10 = 0;
            }
            *(double *)((long)&bezCV[1][0].z + lVar10) = local_2d0.z;
            pdVar1 = (double *)((long)&bezCV[1][0].x + lVar10);
            *pdVar1 = local_2d0.x;
            pdVar1[1] = local_2d0.y;
            *(double *)((long)&bezCV[2][0].z + lVar10) = local_2b8.z;
            pdVar1 = (double *)((long)&bezCV[2][0].x + lVar10);
            *pdVar1 = local_2b8.x;
            pdVar1[1] = local_2b8.y;
          }
          if (dVar3 <= local_480) {
            dVar3 = local_480;
          }
          local_480 = dVar3;
          (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00)
          ;
          bVar6 = true;
        }
      }
      if (!bVar6) break;
      bVar5 = 2 < uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar17 != 4);
    if (bVar5) {
      bezCV[1][1].z = ON_3dPoint::Origin.z;
      dVar3 = ON_3dPoint::Origin.y;
      bezCV[1][1].x = ON_3dPoint::Origin.x;
      bezCV[1][1].y = dVar3;
      bezCV[1][2].z = ON_3dPoint::Origin.z;
      dVar3 = ON_3dPoint::Origin.y;
      bezCV[1][2].x = ON_3dPoint::Origin.x;
      bezCV[1][2].y = dVar3;
      dVar3 = ON_3dPoint::Origin.y;
      bezCV[2][1].x = ON_3dPoint::Origin.x;
      bezCV[2][1].y = dVar3;
      bezCV[2][1].z = ON_3dPoint::Origin.z;
      dVar3 = ON_3dPoint::Origin.y;
      bezCV[2][2].x = ON_3dPoint::Origin.x;
      bezCV[2][2].y = dVar3;
      bezCV[2][2].z = ON_3dPoint::Origin.z;
      ON_BezierSurface::ON_BezierSurface(&local_370);
      local_370.m_dim = 3;
      local_370.m_is_rat = 0;
      local_370.m_order[0] = 4;
      local_370.m_order[1] = 4;
      local_370.m_cv_stride[0] = 0xc;
      local_370.m_cv_stride[1] = 3;
      local_348.z = ON_3dPoint::Origin.z;
      local_348.x = ON_3dPoint::Origin.x;
      local_348.y = ON_3dPoint::Origin.y;
      local_330 = ON_3dPoint::Origin.x;
      dStack_328 = ON_3dPoint::Origin.y;
      local_320 = ON_3dPoint::Origin.z;
      local_318 = ON_3dPoint::Origin.x;
      dStack_310 = ON_3dPoint::Origin.y;
      local_308 = ON_3dPoint::Origin.z;
      local_300 = ON_3dPoint::Origin.x;
      dStack_2f8 = ON_3dPoint::Origin.y;
      local_2f0 = ON_3dPoint::Origin.z;
      local_440 = 0;
      lVar10 = 0;
      local_370.m_cv = (double *)bezCV;
      do {
        dVar3 = ON_Interval::ParameterAt(&local_3b8,(double)(&DAT_006d5d40)[lVar10 * 2]);
        ON_Interval::ParameterAt(&local_3a8,(double)(&DAT_006d5d48)[lVar10 * 2]);
        (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37])
                  (SUB84(dVar3,0),this,0,3,&local_348 + lVar10,0,&local_440);
        ON_3dPoint::ON_3dPoint(local_238,0.0,0.0,0.0);
        ON_3dPoint::ON_3dPoint(&local_3d8,0.0,0.0,0.0);
        lVar16 = 0;
        pOVar15 = *bezCV;
        do {
          lVar14 = 0;
          pOVar11 = pOVar15;
          do {
            if (1 < ((int)lVar14 - 1U | (int)lVar16 - 1U)) {
              ::operator*(&local_438,
                          *(double *)
                           ((long)&DAT_006d5d00 + lVar16 * 8 + (ulong)(((uint)lVar10 & 1) << 5)) *
                          *(double *)
                           ((long)&DAT_006d5d00 + (lVar10 * 0x10 & 0xffffffffffffffe0U) + lVar14 * 8
                           ),pOVar11);
              ON_3dVector::ON_3dVector(&local_418,&local_438);
              ON_3dPoint::operator+=(local_238,&local_418);
            }
            lVar14 = lVar14 + 1;
            pOVar11 = pOVar11 + 1;
          } while (lVar14 != 4);
          lVar16 = lVar16 + 1;
          pOVar15 = pOVar15 + 4;
        } while (lVar16 != 4);
        ::operator*(&local_438,2.25,&local_348 + lVar10);
        ON_3dPoint::operator/(&local_3f8,local_238,324.0);
        ON_3dPoint::operator-(&local_418,&local_438,&local_3f8);
        ON_3dPoint::operator=(&local_2e8 + lVar10,&local_418);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ON_2dex::ON_2dex((ON_2dex *)&local_3d8,1,1);
      ON_2dex::ON_2dex((ON_2dex *)&local_3d8.y,2,1);
      ON_2dex::ON_2dex((ON_2dex *)&local_3d8.z,1,2);
      ON_2dex::ON_2dex(&local_3c0,2,2);
      lVar10 = 0;
      do {
        ::operator*(&local_3f8,*(double *)((long)&DAT_006d5d80 + lVar10 * 4),&local_2e8);
        ::operator*(&local_250,*(double *)((long)&DAT_006d5d88 + lVar10 * 4),&local_2d0);
        ON_3dPoint::operator+(&local_438,&local_3f8,&local_250);
        ::operator*(&local_268,*(double *)((long)&DAT_006d5d90 + lVar10 * 4),&local_2b8);
        ON_3dPoint::operator+((ON_3dPoint *)&local_418,&local_438,&local_268);
        ::operator*(&local_280,*(double *)((long)&DAT_006d5d98 + lVar10 * 4),&local_2a0);
        ON_3dPoint::operator+(local_238,(ON_3dPoint *)&local_418,&local_280);
        iVar7 = *(int *)((long)&local_3d8.x + lVar10);
        iVar9 = *(int *)((long)&local_3d8.x + lVar10 + 4);
        bezCV[iVar7][iVar9].z = local_238[0].z;
        bezCV[iVar7][iVar9].x = local_238[0].x;
        bezCV[iVar7][iVar9].y = local_238[0].y;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x20);
      local_490 = 0.0;
      pOVar15 = &local_348;
      lVar10 = 0;
      pOVar11 = local_238;
      do {
        ON_3dPoint::ON_3dPoint(pOVar11,0.0,0.0,0.0);
        ON_BezierSurface::Evaluate
                  (&local_370,*(double *)((long)&DAT_006d5d40 + lVar10),
                   *(double *)((long)&DAT_006d5d48 + lVar10),0,3,&pOVar11->x);
        dVar3 = ON_3dPoint::DistanceTo(pOVar15,pOVar11);
        local_490 = local_490 + dVar3;
        pOVar15 = pOVar15 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      uVar12 = this->m_cv_count[1] + this->m_cv_count[0];
      if (0x20 < (int)uVar12) {
        pOVar11 = (ON_3dPoint *)onmalloc((ulong)uVar12 << 3);
      }
      local_3f8.x = (double)pOVar11;
      pdVar1 = &pOVar11->x + this->m_cv_count[0];
      local_3f8.y = (double)pdVar1;
      lVar10 = -1;
      do {
        g_00 = (double *)(&local_3f8.y)[lVar10];
        GetGrevilleAbcissae(this,(int)lVar10 + 1,g_00);
        if (this->m_order[lVar10 + 1] == 4) {
          pdVar2 = this->m_knot[lVar10 + 1];
          dVar3 = pdVar2[2];
          if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
            *g_00 = dVar3;
            g_00[1] = (pdVar2[2] + pdVar2[2] + pdVar2[3]) / 3.0;
          }
          lVar16 = (long)this->m_cv_count[lVar10 + 1];
          if (pdVar2[lVar16 + -1] < pdVar2[lVar16 + 1]) {
            g_00[lVar16 + -1] = pdVar2[lVar16 + -1];
            g_00[lVar16 + -2] =
                 (pdVar2[lVar16 + -1] + pdVar2[lVar16 + -1] + pdVar2[lVar16 + -2]) / 3.0;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 == 0);
      local_418.z = ON_3dPoint::Origin.z;
      local_418.x = ON_3dPoint::Origin.x;
      local_418.y = ON_3dPoint::Origin.y;
      local_438.z = ON_3dPoint::Origin.z;
      local_438.x = ON_3dPoint::Origin.x;
      local_438.y = ON_3dPoint::Origin.y;
      local_440 = 0;
      if (1 < this->m_cv_count[0]) {
        local_458 = 1;
        do {
          iVar7 = 0;
          do {
            if (iVar7 == 0) {
              dVar3 = (*(double *)((long)pOVar11 + local_458 * 8 + -8) + (&pOVar11->x)[local_458]) *
                      0.5;
            }
            else {
              dVar3 = (&pOVar11->x)[local_458];
            }
            s = ON_Interval::NormalizedParameterAt(&local_3b8,dVar3);
            if ((s <= 0.0) || (1.0 <= s)) {
              local_45c = 0x1c;
            }
            else {
              local_45c = 0x1d;
              iVar9 = local_45c;
              if (1 < this->m_cv_count[1]) {
                lVar10 = 1;
                do {
                  iVar13 = 1;
                  do {
                    if (iVar13 == 1) {
                      dVar4 = (pdVar1[lVar10 + -1] + pdVar1[lVar10]) * 0.5;
                    }
                    else {
                      dVar4 = pdVar1[lVar10];
                    }
                    t = ON_Interval::NormalizedParameterAt(&local_3a8,dVar4);
                    iVar9 = 0x22;
                    if ((0.0 < t) && (t < 1.0)) {
                      ON_BezierSurface::Evaluate(&local_370,s,t,0,3,(double *)&local_418);
                      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0x37])(SUB84(dVar3,0),SUB84(dVar4,0),this,0,3,&local_438,0,&local_440);
                      dVar4 = ON_3dPoint::DistanceTo(&local_438,(ON_3dPoint *)&local_418);
                      iVar8 = 0;
                      iVar9 = 0;
                      if ((local_490 * 16.0 < dVar4) &&
                         (((iVar9 = iVar8, local_480 < dVar4 &&
                           (local_480 = dVar4, 0.0 <= local_3e0)) && (local_3e0 < dVar4)))) {
                        iVar9 = 1;
                      }
                    }
                    if ((iVar9 != 0x22) && (iVar9 != 0)) goto LAB_0054838b;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 == 0);
                  iVar9 = 0x20;
LAB_0054838b:
                } while ((iVar9 == 0x20) &&
                        (lVar10 = lVar10 + 1, iVar9 = local_45c, lVar10 < this->m_cv_count[1]));
              }
              local_45c = iVar9;
              if (local_45c == 0x1d) {
                local_45c = 0;
              }
            }
            if ((local_45c != 0x1c) && (local_45c != 0)) goto LAB_005483e7;
            bVar5 = iVar7 == 0;
            iVar7 = iVar7 + 1;
          } while (bVar5);
          local_45c = 0x1a;
LAB_005483e7:
          if (local_45c != 0x1a) goto LAB_0054840b;
          local_458 = local_458 + 1;
        } while (local_458 < this->m_cv_count[0]);
        local_45c = 0x17;
LAB_0054840b:
        if (local_45c != 0x17) {
          local_480 = max_deviation_00;
        }
      }
      ON_BezierSurface::~ON_BezierSurface(&local_370);
      local_470 = local_480;
    }
  }
  return local_470;
}

Assistant:

double ON_NurbsSurface::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4][4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if ( ThisIsNullptr(false) )
    return failed_rc;
  if (this->m_order[0] < 2 || this->m_order[1] < 2)
    return failed_rc;
  if (this->m_cv_count[0] < this->m_order[0] || this->m_cv_count[0] > 64)
    return failed_rc;
  if (this->m_cv_count[1] < this->m_order[1] || this->m_cv_count[1] > 64)
    return failed_rc;

  ON_3dPoint Q[4];
  
  const ON_Interval domain[2] = { this->Domain(0),this->Domain(1) };
  
  const double c[4] = { domain[1][0],domain[0][1],domain[1][1],domain[0][0] };
  const double maximum_deviation = ON_DBL_QNAN;
  double deviation = 0.0;
  for (int side = 0; side < 4; side++)
  {
    ON_Curve* iso = this->IsoCurve((side%2), c[side]);
    if (nullptr == iso)
      return failed_rc;
    const ON_NurbsCurve* nurbs_curve = ON_NurbsCurve::Cast(iso);
    double d
      = (nullptr != nurbs_curve)
      ? nurbs_curve->GetCubicBezierApproximation(
        maximum_deviation,
        (0 == (side % 2)) ? Q : &bezCV[(1 == side) ? 3 : 0][0])
      : ON_DBL_QNAN;
    if (false == (d >= 0.0))
      return failed_rc;
    if (d > deviation)
      deviation = d;
    if (0 == (side % 2))
    {
      int j = (0 == side) ? 0 : 3;
      bezCV[1][j] = Q[1];
      bezCV[2][j] = Q[2];
    }
    delete iso;
  }

  bezCV[1][1] = ON_3dPoint::Origin;
  bezCV[1][2] = ON_3dPoint::Origin;
  bezCV[2][1] = ON_3dPoint::Origin;
  bezCV[2][2] = ON_3dPoint::Origin;

  ON_BezierSurface bezS;
  bezS.m_dim = 3;
  bezS.m_is_rat = 0;
  bezS.m_order[0] = 4;
  bezS.m_order[1] = 4;
  bezS.m_cv_stride[0] = (int)(&bezCV[1][0].x - &bezCV[0][0].x);
  bezS.m_cv_stride[1] = (int)(&bezCV[0][1].x - &bezCV[0][0].x);
  bezS.m_cv = &bezCV[0][0].x;


  // b[0][] = 27*(bernstein cubics at 1/3)
  // b[1][] = 27*(bernstein cubics at 2/3)
  const double b[2][4] = {
    { 8.0, 12.0, 6.0, 1.0 },
    { 1.0, 6.0, 12.0, 8.0 } 
  };

  // uv[4] = {{1/3,1/3}, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // K[n] = (27*27)*bezCV(uv[n])
  // P[n] = this(domain.ParameterAt(uv[n]));
  // 36* M * Transpose[C11,C21,C12,C22] = [X0,X1,X2,X3]
  // uv[4] = {{1/3,1/3{, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // X0 = nurbs_srf(1/3,1/3) - K[0]/(27*27)
  // A[4][4] = 4x4 matrix with rows
  // 36*A[0][] = {b1[1]*b1[1], b1[2]*b1[1], b1[1]*b1[2], b1[2]*b1[2] }
  // 36*A[1][] = {b2[1]*b1[1], b2[2]*b1[1], b2[1]*b1[2], b2[2]*b1[2] }
  // 36*A[2][] = {b1[1]*b2[1], b1[2]*b2[1], b1[1]*b2[2], b1[2]*b2[2] }
  // 36*A[3][] = {b2[1]*b2[1], b2[2]*b2[1], b2[1]*b2[2], b2[2]*b2[2] }
  // K[n] + 36*(A[n][0]*C11 + A[n][1]*C21 + A[n][2]*C12 + A[n][3]*C22) = (27*27)P[n]
  // A*Transpose(C11,C21,C12,C22) = Transpose(X[0],X[1],X[2],X[3])
  // X[n] = ((27*27)P[n] - K[n])/36 = 81/4*P[n] - K[n]/36.0
  // Inverse(A) = M/9.
  // Transpose(C11,C21,C12,C22) = M*Transpose(X[0],X[1],X[2],X[3])/9
  // Q[n] = X[n]/9 = 2.25*P[n] - K[n]/324.0
  // bezCV[cvdex[n].i][cvdex[n].i] = M*Transpose(X[0],X[1],X[2],X[3])/9
  const double bezuv[4][2] =
  {
    {(1.0 / 3.0), (1.0 / 3.0)},
    {(2.0 / 3.0), (1.0 / 3.0)},
    {(1.0 / 3.0), (2.0 / 3.0)},
    {(2.0 / 3.0), (2.0 / 3.0)}
  };
  ON_3dPoint srfP[4] = { ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin };
  int hint[2] = {};
  for (int n = 0; n < 4; n++)
  {
    this->Evaluate(domain[0].ParameterAt(bezuv[n][0]),domain[1].ParameterAt(bezuv[n][1]), 0, 3, &srfP[n].x, 0, hint);
    const double* bi = b[n%2];
    const double* bj = b[n/2];
    ON_3dPoint K(0.0, 0.0, 0.0);
    ON_3dPoint valQ(0, 0, 0);
    for (int i = 0; i < 4; i++) for (int j = 0; j < 4; j++)
    {
      if ((1 == i || 2 == i) && (1 == j || 2 == j))
        continue;
      K += (bi[i] * bj[j])*bezCV[i][j];
    }
    Q[n] = (2.25*srfP[n]) - (K/324.0);
  }

  const ON_2dex cvdex[4]{ON_2dex(1,1),ON_2dex(2,1),ON_2dex(1,2),ON_2dex(2,2)};

  ////const double A[4][4] =
  ////{
  ////  {4.0, 2.0, 2.0, 1.0},
  ////  {2.0, 4.0, 1.0, 2.0},
  ////  {2.0, 1.0, 4.0, 2.0},
  ////  {1.0, 2.0, 2.0, 4.0}
  ////};

  const double M[4][4] =
  {
    {4.0,-2.0,-2.0,1.0},
    {-2.0,4.0,1.0,-2.0},
    {-2.0,1.0,4.0,-2.0},
    {1.0,-2.0,-2.0,4.0}
  };

  for (int n = 0; n < 4; n++)
    bezCV[cvdex[n].i][cvdex[n].j] = M[n][0] * Q[0] + M[n][1] * Q[1] + M[n][2] * Q[2] + M[n][3] * Q[3];

  double zero_tol = 0.0;
  for (int n = 0; n < 4; n++)
  {
    ON_3dPoint bezP(0.0, 0.0, 0.0);
    bezS.Evaluate(bezuv[n][0], bezuv[n][1], 0, 3, &bezP.x);
    double d = srfP[n].DistanceTo(bezP);
    zero_tol += d;
  }
  zero_tol = 16.0*zero_tol;

  double g_buffer[64];
  double* g[2];
  g[0] 
    = (m_cv_count[0] + m_cv_count[1] <= 32)
    ? g_buffer 
    : (double*)onmalloc((m_cv_count[0] + m_cv_count[1]) * sizeof(g[0][0]));
  g[1] = g[0] + m_cv_count[0];
  for (int dir = 0; dir < 2; dir++)
  {
    this->GetGrevilleAbcissae(dir, g[dir]);
    if (4 == this->m_order[dir])
    {
      const double* k = this->m_knot[dir];
      if (k[0] < k[2])
      {
        g[dir][0] = k[2];
        g[dir][1] = (2.0*k[2] + k[3]) / 3.0;
      }
      const int cv_count = this->m_cv_count[dir];
      k += (cv_count - this->m_order[dir]);
      if (k[3] < k[5])
      {
        g[dir][cv_count-1] = k[3];
        g[dir][cv_count-2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  }

  ON_3dPoint bezP(ON_3dPoint::Origin), nurbsP(ON_3dPoint::Origin);
  hint[0] = 0;
  hint[1] = 0;
  for (int i = 1; i < this->m_cv_count[0]; i++)
  {
    for (int passi = 0; passi < 2; passi++)
    {
      const double t0 = (0 == passi) ? 0.5*(g[0][i - 1] + g[0][i]) : g[0][i];
      const double s0 = domain[0].NormalizedParameterAt(t0);
      if (false == (s0 > 0.0 && s0 < 1.0))
        continue;
      for (int j = 1; j < this->m_cv_count[1]; j++)
      {
        for (int passj = 0; passj < 2; passj++)
        {
          const double t1 = (0 == passj) ? 0.5*(g[1][j - 1] + g[1][j]) : g[1][j];
          const double s1 = domain[1].NormalizedParameterAt(t1);
          if (false == (s1 > 0.0 && s1 < 1.0))
            continue;
          bezS.Evaluate(s0,s1, 0, 3, &bezP.x);
          this->Evaluate(t0,t1, 0, 3, &nurbsP.x, 0, hint);
          double d = nurbsP.DistanceTo(bezP);
          if (d > zero_tol && d > deviation)
          {
            deviation = d;
            if (max_deviation >= 0.0 && deviation > max_deviation)
              return failed_rc;
          }
        }
      }
    }
  }

  return deviation;
}